

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void deleteProcess(void)

{
  int iVar1;
  size_t sVar2;
  list<MemBlock*,std::allocator<MemBlock*>> *plVar3;
  long *plVar4;
  list<MemBlock*,std::allocator<MemBlock*>> *plVar5;
  char *pcVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  long lVar9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  long lVar12;
  list<MemBlock*,std::allocator<MemBlock*>> *plVar13;
  bool bVar14;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> __carry;
  int pid;
  Process *process;
  _List_node_base local_678;
  _List_node_base *local_668;
  int local_65c;
  _List_node_base *local_658;
  _List_node_base local_650;
  long local_640;
  _List_node_base local_638;
  long local_628;
  list<MemBlock*,std::allocator<MemBlock*>> local_620 [1512];
  list<MemBlock*,std::allocator<MemBlock*>> local_38 [8];
  
  local_65c = 0;
  pcVar6 = strtok((char *)0x0," ");
  if (pcVar6 == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"have no enough args",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    return;
  }
  __isoc99_sscanf(pcVar6,"%d",&local_65c);
  local_658 = (_List_node_base *)0x0;
  p_Var7 = processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl._M_node
      .super__List_node_base._M_next != (_List_node_base *)&processList_abi_cxx11_) {
    do {
      if (*(int *)&(p_Var7[1]._M_next)->_M_next == local_65c) {
        local_658 = p_Var7[1]._M_next;
      }
      p_Var7 = (((_List_base<Process_*,_std::allocator<Process_*>_> *)&p_Var7->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next;
    } while (p_Var7 != (_List_node_base *)&processList_abi_cxx11_);
  }
  if (local_658 == (_List_node_base *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"no process was found with that pid!",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  else {
    std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::remove
              (&processList_abi_cxx11_,(char *)&local_658);
    std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::remove
              (&usedMemBlockList_abi_cxx11_,(char *)&local_658[3]._M_prev);
    p_Var7 = local_658;
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = p_Var7[3]._M_prev;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
    _M_node._M_size =
         freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node._M_size + 1;
    if ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node.super__List_node_base._M_next !=
         (_List_node_base *)&freeMemBlockList_abi_cxx11_) &&
       ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node.super__List_node_base._M_next)->_M_next !=
        (_List_node_base *)&freeMemBlockList_abi_cxx11_)) {
      local_668 = (_List_node_base *)0x0;
      lVar9 = 0;
      do {
        lVar12 = (long)&local_638._M_next + lVar9;
        *(long *)((long)&local_638._M_prev + lVar9) = lVar12;
        *(long *)lVar12 = lVar12;
        *(undefined8 *)((long)&local_628 + lVar9) = 0;
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x600);
      lVar9 = 0;
      local_678._M_next = &local_678;
      local_678._M_prev = &local_678;
      do {
        lVar12 = lVar9;
        p_Var7 = &local_638;
        if ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
             _M_impl._M_node.super__List_node_base._M_next)->_M_next != local_678._M_next &&
            local_678._M_next !=
            freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
            _M_impl._M_node.super__List_node_base._M_next) {
          std::__detail::_List_node_base::_M_transfer
                    (local_678._M_next,
                     freeMemBlockList_abi_cxx11_.
                     super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                     super__List_node_base._M_next);
          local_668 = (_List_node_base *)((long)&local_668->_M_next + 1);
          freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
          _M_impl._M_node._M_size =
               freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>
               ._M_impl._M_node._M_size - 1;
        }
        p_Var8 = (_List_node_base *)((long)&local_638._M_next + lVar12);
        bVar14 = lVar12 == 0;
        if (bVar14) {
          lVar9 = 0x18;
        }
        else if (local_638._M_next == p_Var7) {
          lVar9 = 0;
        }
        else {
          do {
            p_Var11 = p_Var7;
            std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<deleteProcess()::__0>
                      ((list<MemBlock*,std::allocator<MemBlock*>> *)p_Var11,&local_678);
            std::__detail::_List_node_base::swap(&local_678,p_Var11);
            p_Var10 = p_Var11[1]._M_next;
            p_Var11[1]._M_next = local_668;
            p_Var7 = (_List_node_base *)&p_Var11[1]._M_prev;
            bVar14 = p_Var7 == p_Var8;
            if (bVar14) {
              lVar9 = 0x18;
              goto LAB_001026ba;
            }
            local_668 = p_Var10;
          } while (*(_List_node_base **)p_Var7 != p_Var7);
          lVar9 = 0;
LAB_001026ba:
          p_Var7 = (_List_node_base *)&p_Var11[1]._M_prev;
          local_668 = p_Var10;
        }
        std::__detail::_List_node_base::swap(&local_678,p_Var7);
        p_Var10 = p_Var7[1]._M_next;
        p_Var7[1]._M_next = local_668;
        lVar9 = lVar9 + lVar12;
        local_668 = p_Var10;
      } while (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>
               ._M_impl._M_node.super__List_node_base._M_next !=
               (_List_node_base *)&freeMemBlockList_abi_cxx11_);
      if (lVar9 != 0x18) {
        plVar13 = local_620;
        do {
          std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<deleteProcess()::__0>
                    (plVar13,plVar13 + -0x18);
          plVar13 = plVar13 + 0x18;
        } while (plVar13 !=
                 (list<MemBlock*,std::allocator<MemBlock*>> *)((long)&local_638._M_next + lVar9));
      }
      plVar13 = local_620 + 0x5e8;
      plVar4 = &local_628;
      if (!bVar14) {
        plVar4 = &local_640;
        p_Var8 = (_List_node_base *)((long)&local_650._M_next + lVar12);
      }
      std::__detail::_List_node_base::swap((_List_node_base *)&freeMemBlockList_abi_cxx11_,p_Var8);
      sVar2 = *(size_t *)((long)plVar4 + lVar12);
      *(size_t *)((long)plVar4 + lVar12) =
           freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
           _M_impl._M_node._M_size;
      freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node._M_size = sVar2;
      do {
        plVar5 = plVar13 + -0x18;
        plVar13 = plVar13 + -0x18;
        plVar5 = *(list<MemBlock*,std::allocator<MemBlock*>> **)plVar5;
        while (plVar5 != plVar13) {
          plVar3 = *(list<MemBlock*,std::allocator<MemBlock*>> **)plVar5;
          operator_delete(plVar5);
          plVar5 = plVar3;
        }
      } while ((_List_node_base *)plVar13 != &local_638);
      p_Var7 = local_678._M_next;
      if (local_678._M_next != &local_678) {
        do {
          p_Var8 = p_Var7->_M_next;
          operator_delete(p_Var7);
          p_Var7 = p_Var8;
        } while (p_Var8 != &local_678);
      }
    }
    local_650._M_next = &local_650;
    local_640 = 0;
    local_650._M_prev = local_650._M_next;
    if (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
        _M_impl._M_node.super__List_node_base._M_next !=
        (_List_node_base *)&freeMemBlockList_abi_cxx11_) {
      do {
        p_Var8 = freeMemBlockList_abi_cxx11_.
                 super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                 super__List_node_base._M_next;
        p_Var7 = freeMemBlockList_abi_cxx11_.
                 super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                 super__List_node_base._M_next[1]._M_next;
        freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
        _M_impl._M_node._M_size =
             freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
             _M_impl._M_node._M_size - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var8);
        while (p_Var8 = freeMemBlockList_abi_cxx11_.
                        super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                        super__List_node_base._M_next,
              freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
              _M_impl._M_node.super__List_node_base._M_next !=
              (_List_node_base *)&freeMemBlockList_abi_cxx11_) {
          p_Var10 = freeMemBlockList_abi_cxx11_.
                    super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                    super__List_node_base._M_next[1]._M_next;
          freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
          _M_impl._M_node._M_size =
               freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>
               ._M_impl._M_node._M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var8);
          iVar1 = *(int *)((long)&p_Var7->_M_next + 4);
          if (*(int *)&p_Var7->_M_next + iVar1 != *(int *)&p_Var10->_M_next) {
            p_Var8 = (_List_node_base *)operator_new(0x18);
            p_Var8[1]._M_next = p_Var10;
            std::__detail::_List_node_base::_M_hook(p_Var8);
            local_640 = local_640 + 1;
            break;
          }
          *(int *)((long)&p_Var7->_M_next + 4) = iVar1 + *(int *)((long)&p_Var10->_M_next + 4);
          operator_delete(p_Var10);
        }
        p_Var8 = (_List_node_base *)operator_new(0x18);
        p_Var8[1]._M_next = p_Var7;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        local_640 = local_640 + 1;
      } while (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>
               ._M_impl._M_node.super__List_node_base._M_next !=
               (_List_node_base *)&freeMemBlockList_abi_cxx11_);
    }
    freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)&freeMemBlockList_abi_cxx11_;
    freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)&freeMemBlockList_abi_cxx11_;
    freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
    _M_node._M_size = 0;
    for (p_Var7 = local_650._M_next; p_Var7 != &local_650; p_Var7 = p_Var7->_M_next) {
      p_Var8 = p_Var7[1]._M_next;
      p_Var10 = (_List_node_base *)operator_new(0x18);
      p_Var10[1]._M_next = p_Var8;
      std::__detail::_List_node_base::_M_hook(p_Var10);
      freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node._M_size =
           freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
           _M_impl._M_node._M_size + 1;
    }
    if (local_658 != (_List_node_base *)0x0) {
      operator_delete(local_658);
    }
    if ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node.super__List_node_base._M_next !=
         (_List_node_base *)&freeMemBlockList_abi_cxx11_) &&
       ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node.super__List_node_base._M_next)->_M_next !=
        (_List_node_base *)&freeMemBlockList_abi_cxx11_)) {
      local_668 = (_List_node_base *)0x0;
      lVar9 = 0;
      do {
        lVar12 = (long)&local_638._M_next + lVar9;
        *(long *)((long)&local_638._M_prev + lVar9) = lVar12;
        *(long *)lVar12 = lVar12;
        *(undefined8 *)((long)&local_628 + lVar9) = 0;
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x600);
      lVar9 = 0;
      local_678._M_next = &local_678;
      local_678._M_prev = &local_678;
      do {
        lVar12 = lVar9;
        p_Var7 = &local_638;
        if ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
             _M_impl._M_node.super__List_node_base._M_next)->_M_next != local_678._M_next &&
            local_678._M_next !=
            freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
            _M_impl._M_node.super__List_node_base._M_next) {
          std::__detail::_List_node_base::_M_transfer
                    (local_678._M_next,
                     freeMemBlockList_abi_cxx11_.
                     super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                     super__List_node_base._M_next);
          local_668 = (_List_node_base *)((long)&local_668->_M_next + 1);
          freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
          _M_impl._M_node._M_size =
               freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>
               ._M_impl._M_node._M_size - 1;
        }
        p_Var8 = (_List_node_base *)((long)&local_638._M_next + lVar12);
        bVar14 = lVar12 == 0;
        if (bVar14) {
          lVar9 = 0x18;
        }
        else if (local_638._M_next == p_Var7) {
          lVar9 = 0;
        }
        else {
          do {
            p_Var11 = p_Var7;
            std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<deleteProcess()::__1>
                      ((list<MemBlock*,std::allocator<MemBlock*>> *)p_Var11,&local_678);
            std::__detail::_List_node_base::swap(&local_678,p_Var11);
            p_Var10 = p_Var11[1]._M_next;
            p_Var11[1]._M_next = local_668;
            p_Var7 = (_List_node_base *)&p_Var11[1]._M_prev;
            bVar14 = p_Var7 == p_Var8;
            if (bVar14) {
              lVar9 = 0x18;
              goto LAB_001029f5;
            }
            local_668 = p_Var10;
          } while (*(_List_node_base **)p_Var7 != p_Var7);
          lVar9 = 0;
LAB_001029f5:
          p_Var7 = (_List_node_base *)&p_Var11[1]._M_prev;
          local_668 = p_Var10;
        }
        std::__detail::_List_node_base::swap(&local_678,p_Var7);
        p_Var10 = p_Var7[1]._M_next;
        p_Var7[1]._M_next = local_668;
        lVar9 = lVar9 + lVar12;
        local_668 = p_Var10;
      } while (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>
               ._M_impl._M_node.super__List_node_base._M_next !=
               (_List_node_base *)&freeMemBlockList_abi_cxx11_);
      if (lVar9 != 0x18) {
        plVar13 = local_620;
        do {
          std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<deleteProcess()::__1>
                    (plVar13,plVar13 + -0x18);
          plVar13 = plVar13 + 0x18;
        } while (plVar13 !=
                 (list<MemBlock*,std::allocator<MemBlock*>> *)((long)&local_638._M_next + lVar9));
      }
      plVar13 = local_620 + 0x5e8;
      plVar4 = &local_628;
      if (!bVar14) {
        plVar4 = &local_640;
        p_Var8 = (_List_node_base *)((long)&local_650._M_next + lVar12);
      }
      std::__detail::_List_node_base::swap((_List_node_base *)&freeMemBlockList_abi_cxx11_,p_Var8);
      sVar2 = *(size_t *)((long)plVar4 + lVar12);
      *(size_t *)((long)plVar4 + lVar12) =
           freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
           _M_impl._M_node._M_size;
      freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node._M_size = sVar2;
      do {
        plVar5 = plVar13 + -0x18;
        plVar13 = plVar13 + -0x18;
        plVar5 = *(list<MemBlock*,std::allocator<MemBlock*>> **)plVar5;
        while (plVar5 != plVar13) {
          plVar3 = *(list<MemBlock*,std::allocator<MemBlock*>> **)plVar5;
          operator_delete(plVar5);
          plVar5 = plVar3;
        }
      } while ((_List_node_base *)plVar13 != &local_638);
      p_Var7 = local_678._M_next;
      if (local_678._M_next != &local_678) {
        do {
          p_Var8 = p_Var7->_M_next;
          operator_delete(p_Var7);
          p_Var7 = p_Var8;
        } while (p_Var8 != &local_678);
      }
    }
    p_Var7 = local_650._M_next;
    while (p_Var7 != &local_650) {
      p_Var8 = p_Var7->_M_next;
      operator_delete(p_Var7);
      p_Var7 = p_Var8;
    }
  }
  return;
}

Assistant:

void deleteProcess() {
    // 获取参数
    int pid = 0;
    char *p = strtok(NULL, " ");
    if (!p) {
        cout << "have no enough args" << endl;
        return;
    }
    sscanf(p, "%d", &pid);
    // 在链表中寻找具有该pid的进程
    Process *process = nullptr;
    for (Process *i : processList)
        if (i->pid == pid) process = i;
    // 如果找到了
    if (process) {
        // 将process从链表中移出
        processList.remove(process);
        // 将process用过的内存块从使用过的内存链表中移出并且加入空闲内存链表
        usedMemBlockList.remove(process->memBlock);
        freeMemBlockList.push_back(process->memBlock);
        // 将空闲内存链表按照起始地址排序
        freeMemBlockList.sort([=](MemBlock *a, MemBlock *b) -> bool {
            return a->start < b->start;
        });
        // 看这些链表中有没有可以合并的项
        list<MemBlock *> temp;
        while (!freeMemBlockList.empty()) {
            MemBlock *block = freeMemBlockList.front();
            freeMemBlockList.pop_front();
            while (!freeMemBlockList.empty()) {
                MemBlock *another = freeMemBlockList.front();
                freeMemBlockList.pop_front();
                if (block->start + block->length == another->start) {
                    block->length = block->length + another->length;
                    delete another;
                } else {
                    temp.push_front(another);
                    break;
                }
            }
            temp.push_back(block);
        }
        freeMemBlockList.clear();
        for (MemBlock *i : temp) freeMemBlockList.push_back(i);
        // 删除process
        delete process;
        // 将空闲内存链表按照起始地址排序
        freeMemBlockList.sort([=](MemBlock *a, MemBlock *b) -> bool {
            return a->start < b->start;
        });
    } else cout << "no process was found with that pid!" << endl;
}